

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O2

bool __thiscall SWDParser::IsLineReset(SWDParser *this,SWDLineReset *reset)

{
  vector<SWDBit,_std::allocator<SWDBit>_> *__x;
  int *piVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pSVar5;
  long lVar6;
  SWDBit bit;
  SWDBit local_58;
  
  pSVar5 = (reset->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((reset->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar5) {
    (reset->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar5;
  }
  __x = &this->mBitsBuffer;
  lVar6 = 0;
  uVar3 = 0;
  while (uVar4 = uVar3, uVar4 != 0x32) {
    pSVar5 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pSVar5) / 0x28) <= uVar4) {
      ParseBit(&bit,this);
      std::vector<SWDBit,_std::allocator<SWDBit>_>::emplace_back<SWDBit>(__x,&bit);
      pSVar5 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    piVar1 = (int *)((long)&pSVar5->state_rising + lVar6);
    lVar6 = lVar6 + 0x28;
    uVar3 = uVar4 + 1;
    if (*piVar1 != 1) goto LAB_00109edf;
  }
  while( true ) {
    ParseBit(&local_58,this);
    bit.low_end = local_58.low_end;
    bit.rising = local_58.rising;
    bit.falling = local_58.falling;
    bit.state_rising = local_58.state_rising;
    bit.state_falling = local_58.state_falling;
    uVar2 = bit._0_8_;
    bit.low_start = local_58.low_start;
    bit.state_rising = local_58.state_rising;
    bit._0_8_ = uVar2;
    if (bit.state_rising != BIT_HIGH) break;
    std::vector<SWDBit,_std::allocator<SWDBit>_>::push_back(__x,&bit);
  }
  std::vector<SWDBit,_std::allocator<SWDBit>_>::operator=(&reset->bits,__x);
  pSVar5 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar5) {
    (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar5;
  }
  std::vector<SWDBit,_std::allocator<SWDBit>_>::push_back(__x,&bit);
LAB_00109edf:
  return 0x31 < uVar4;
}

Assistant:

bool SWDParser::IsLineReset( SWDLineReset& reset )
{
    reset.Clear();

    // we need at least 50 bits with a value of 1
    for( size_t cnt = 0; cnt < 50; cnt++ )
    {
        if( cnt >= mBitsBuffer.size() )
            mBitsBuffer.push_back( ParseBit() );

        // we can't have a low bit
        if( !mBitsBuffer[ cnt ].IsHigh() )
            return false;
    }

    SWDBit bit;
    while( true )
    {
        bit = ParseBit();
        if( !bit.IsHigh() )
            break;

        mBitsBuffer.push_back( bit );
    }

    // give the bits to the reset object
    reset.bits = mBitsBuffer;
    mBitsBuffer.clear();

    // keep the high bit because that one is probably next operation's start bit
    mBitsBuffer.push_back( bit );

    return true;
}